

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O2

QRect __thiscall QAccessibleDockWidget::rect(QAccessibleDockWidget *this)

{
  byte bVar1;
  long lVar2;
  QWidget *pQVar3;
  QPoint QVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  QRect QVar6;
  QRect QVar7;
  QPoint local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))();
  bVar1 = *(byte *)(*(long *)(lVar2 + 0x20) + 0xc);
  pQVar3 = (QWidget *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
  if ((bVar1 & 1) == 0) {
    QVar6 = QWidget::rect(pQVar3);
    pQVar3 = (QWidget *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    local_38 = QVar6._0_8_;
    QVar4 = QWidget::mapToGlobal(pQVar3,&local_38);
    QVar7._8_8_ = (QVar6._8_8_ - (long)QVar6._0_8_) + (long)QVar4;
    QVar7.x1.m_i = QVar4.xp.m_i;
    QVar7.y1.m_i = QVar4.yp.m_i;
    uVar5 = (ulong)(uint)(QVar4.yp.m_i.m_i + (QVar6.y2.m_i.m_i - QVar6.y1.m_i));
  }
  else {
    QVar7 = QWidget::frameGeometry(pQVar3);
    QVar4 = QVar7._0_8_;
    uVar5 = QVar7._8_8_ >> 0x20;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    QVar6._0_8_ = QVar7._0_8_ & 0xffffffff | (ulong)QVar4 & 0xffffffff00000000;
    QVar6._8_8_ = QVar7._8_8_ & 0xffffffff | uVar5 << 0x20;
    return QVar6;
  }
  __stack_chk_fail();
}

Assistant:

QRect QAccessibleDockWidget::rect() const
{
    QRect rect;

    if (dockWidget()->isFloating()) {
        rect = dockWidget()->frameGeometry();
    } else {
        rect = dockWidget()->rect();
        rect.moveTopLeft(dockWidget()->mapToGlobal(rect.topLeft()));
    }

    return rect;
}